

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprFor * AnalyzeFor(ExpressionContext *ctx,SynFor *syntax)

{
  uint *puVar1;
  SynBlock *syntax_00;
  ScopeData *pSVar2;
  TypeBase *pTVar3;
  int iVar4;
  SynBlock *syntax_01;
  ExprBlock *pEVar5;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  SynBase *source;
  ExprBase *node;
  undefined4 extraout_var_01;
  ExprFor *pEVar9;
  undefined4 extraout_var_03;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> iteration;
  IntrusiveList<ExprBase> local_48;
  undefined4 extraout_var_02;
  
  ExpressionContext::PushLoopScope(ctx,false,false);
  syntax_00 = (SynBlock *)syntax->initializer;
  if ((syntax_00 == (SynBlock *)0x0) ||
     (syntax_01 = syntax_00, (syntax_00->super_SynBase).typeID != 0x26)) {
    syntax_01 = (SynBlock *)0x0;
  }
  if (syntax_01 == (SynBlock *)0x0) {
    if (syntax_00 == (SynBlock *)0x0) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar5 = (ExprBlock *)CONCAT44(extraout_var_03,iVar4);
      pTVar3 = ctx->typeVoid;
      (pEVar5->super_ExprBase).typeID = 2;
      (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar5->super_ExprBase).type = pTVar3;
      (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar5->super_ExprBase).listed = false;
      (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
    }
    else {
      pEVar5 = (ExprBlock *)AnalyzeStatement(ctx,(SynBase *)syntax_00);
    }
  }
  else {
    pEVar5 = AnalyzeBlock(ctx,syntax_01,false);
  }
  pEVar6 = AnalyzeExpression(ctx,syntax->condition);
  pEVar6 = CreateConditionCast(ctx,pEVar6->source,pEVar6);
  pSVar2 = ctx->scope;
  puVar1 = &pSVar2->breakDepth;
  *puVar1 = *puVar1 + 1;
  puVar1 = &pSVar2->contiueDepth;
  *puVar1 = *puVar1 + 1;
  if (syntax->increment == (SynBase *)0x0) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar3 = ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
  }
  else {
    pEVar7 = AnalyzeStatement(ctx,syntax->increment);
  }
  if (syntax->body == (SynBase *)0x0) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
    pTVar3 = ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
  }
  else {
    pEVar8 = AnalyzeStatement(ctx,syntax->body);
  }
  local_48.head = (ExprBase *)0x0;
  local_48.tail = (ExprBase *)0x0;
  source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0));
      pSVar2 = pSVar2->scope) {
    onwerFunction = pSVar2->ownerFunction;
    if (onwerFunction != (FunctionData *)0x0) goto LAB_001711f0;
  }
  onwerFunction = (FunctionData *)0x0;
LAB_001711f0:
  node = CreateBlockUpvalueClose(ctx,source,onwerFunction,ctx->scope);
  if (node != (ExprBase *)0x0) {
    IntrusiveList<ExprBase>::push_back(&local_48,node);
  }
  IntrusiveList<ExprBase>::push_back(&local_48,pEVar7);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
  pTVar3 = ctx->typeVoid;
  pEVar7->typeID = 0x36;
  pEVar7->source = &syntax->super_SynBase;
  pEVar7->type = pTVar3;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_0022a0b0;
  pEVar7[1]._vptr_ExprBase = (_func_int **)local_48.head;
  *(ExprBase **)&pEVar7[1].typeID = local_48.tail;
  pEVar7[1].source = (SynBase *)0x0;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pEVar9 = (ExprFor *)CONCAT44(extraout_var_02,iVar4);
  pTVar3 = ctx->typeVoid;
  (pEVar9->super_ExprBase).typeID = 0x30;
  (pEVar9->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar9->super_ExprBase).type = pTVar3;
  (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar9->super_ExprBase).listed = false;
  (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_0022a2e0;
  pEVar9->initializer = &pEVar5->super_ExprBase;
  pEVar9->condition = pEVar6;
  pEVar9->increment = pEVar7;
  pEVar9->body = pEVar8;
  return pEVar9;
}

Assistant:

ExprFor* AnalyzeFor(ExpressionContext &ctx, SynFor *syntax)
{
	ctx.PushLoopScope(false, false);

	ExprBase *initializer = NULL;

	if(SynBlock *block = getType<SynBlock>(syntax->initializer))
		initializer = AnalyzeBlock(ctx, block, false);
	else if(syntax->initializer)
		initializer = AnalyzeStatement(ctx, syntax->initializer);
	else
		initializer = new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ctx.scope->breakDepth++;
	ctx.scope->contiueDepth++;

	ExprBase *increment = syntax->increment ? AnalyzeStatement(ctx, syntax->increment) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
	ExprBase *body = syntax->body ? AnalyzeStatement(ctx, syntax->body) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	IntrusiveList<ExprBase> iteration;

	if(ExprBase *closures = CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope))
		iteration.push_back(closures);

	iteration.push_back(increment);

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, iteration, NULL);

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, block, body);
}